

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

int peekInternal(uint8_t distance)

{
  undefined1 auVar1 [16];
  uint uVar2;
  Expansion *pEVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  LexerState *pLVar10;
  size_t nbChars;
  
  pEVar3 = (Expansion *)&lexerState->expansions;
  while( true ) {
    pEVar3 = pEVar3->parent;
    uVar9 = (ulong)distance;
    if (pEVar3 == (Expansion *)0x0) break;
    uVar5 = pEVar3->offset;
    uVar6 = pEVar3->size - uVar5;
    if (pEVar3->size < uVar5) {
      __assert_fail("exp->offset <= exp->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                    ,0x330,"peekInternal");
    }
    if (uVar9 < uVar6) {
      return (int)(pEVar3->contents).unowned[uVar9 + uVar5];
    }
    distance = distance - (char)uVar6;
  }
  if (0x29 < distance) {
    fatalerror("Internal lexer error: buffer has insufficient size for peeking (%u >= %u)\n",
               (ulong)distance,0x2a);
  }
  if (lexerState->isMmapped == true) {
    uVar9 = uVar9 + (lexerState->field_2).field_0.offset;
    if (uVar9 < (lexerState->field_2).field_0.size) {
      return (uint)(byte)(lexerState->field_2).field_0.ptr[uVar9];
    }
LAB_0010dbe5:
    uVar2 = 0xffffffff;
  }
  else {
    uVar5 = (lexerState->field_2).field_1.nbChars;
    pLVar10 = lexerState;
    if (uVar5 <= uVar9) {
      nbChars = 0x2a - uVar5;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar5 + (lexerState->field_2).field_0.size;
      sVar7 = SUB168(auVar1 % ZEXT816(0x2a),0);
      if ((uint)(SUB164(auVar1 % ZEXT816(0x2a),0) + (int)nbChars) < 0x2b) {
LAB_0010dbb3:
        sVar7 = readInternal(sVar7,nbChars);
        pLVar10 = lexerState;
        uVar5 = sVar7 + (lexerState->field_2).field_1.nbChars;
        (lexerState->field_2).field_1.nbChars = uVar5;
      }
      else {
        uVar6 = 0x2a - sVar7;
        sVar4 = readInternal(sVar7,uVar6);
        pLVar10 = lexerState;
        uVar5 = (lexerState->field_2).field_1.nbChars + sVar4;
        (lexerState->field_2).field_1.nbChars = uVar5;
        sVar8 = sVar7 + sVar4;
        sVar7 = 0;
        if (sVar8 != 0x2a) {
          sVar7 = sVar8;
        }
        if ((uVar6 <= sVar4) && (nbChars = nbChars - sVar4, nbChars != 0)) goto LAB_0010dbb3;
      }
      if (uVar5 <= uVar9) goto LAB_0010dbe5;
    }
    uVar2 = (uint)*(byte *)((long)&pLVar10->field_2 +
                           (uVar9 + (pLVar10->field_2).field_0.size) % 0x2a + 0x10);
  }
  return uVar2;
}

Assistant:

static int peekInternal(uint8_t distance)
{
	for (struct Expansion *exp = lexerState->expansions; exp; exp = exp->parent) {
		// An expansion that has reached its end will have `exp->offset` == `exp->size`,
		// and `peekInternal` will continue with its parent
		assert(exp->offset <= exp->size);
		if (distance < exp->size - exp->offset)
			return exp->contents.unowned[exp->offset + distance];
		distance -= exp->size - exp->offset;
	}

	if (distance >= LEXER_BUF_SIZE)
		fatalerror("Internal lexer error: buffer has insufficient size for peeking (%"
			   PRIu8 " >= %u)\n", distance, LEXER_BUF_SIZE);

	if (lexerState->isMmapped) {
		if (lexerState->offset + distance >= lexerState->size)
			return EOF;

		return (unsigned char)lexerState->ptr[lexerState->offset + distance];
	}

	if (lexerState->nbChars <= distance) {
		// Buffer isn't full enough, read some chars in
		size_t target = LEXER_BUF_SIZE - lexerState->nbChars; // Aim: making the buf full

		// Compute the index we'll start writing to
		size_t writeIndex = (lexerState->index + lexerState->nbChars) % LEXER_BUF_SIZE;

		// If the range to fill passes over the buffer wrapping point, we need two reads
		if (writeIndex + target > LEXER_BUF_SIZE) {
			size_t nbExpectedChars = LEXER_BUF_SIZE - writeIndex;
			size_t nbReadChars = readInternal(writeIndex, nbExpectedChars);

			lexerState->nbChars += nbReadChars;

			writeIndex += nbReadChars;
			if (writeIndex == LEXER_BUF_SIZE)
				writeIndex = 0;

			// If the read was incomplete, don't perform a second read
			target -= nbReadChars;
			if (nbReadChars < nbExpectedChars)
				target = 0;
		}
		if (target != 0)
			lexerState->nbChars += readInternal(writeIndex, target);

		// If there aren't enough chars even after refilling, give up
		if (lexerState->nbChars <= distance)
			return EOF;
	}

	return (unsigned char)lexerState->buf[(lexerState->index + distance) % LEXER_BUF_SIZE];
}